

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O1

LY_ERR lyd_validate_subtree
                 (lyd_node *root,ly_set *node_when,ly_set *node_types,ly_set *meta_types,
                 ly_set *ext_node,ly_set *ext_val,uint32_t val_opts,uint32_t int_opts,
                 ly_ht *getnext_ht,lyd_node **diff)

{
  ushort uVar1;
  LY_ERR LVar2;
  LY_ERR in_EAX;
  lyd_node **pplVar3;
  lysc_when *plVar4;
  lyd_node *plVar5;
  LY_ERR LVar6;
  lyd_node_inner *plVar7;
  lyd_node *sibling;
  int iVar8;
  lyd_meta *object;
  lysc_type *type;
  
  if (root == (lyd_node *)0x0) {
    LVar6 = LY_SUCCESS;
    iVar8 = 0;
  }
  else {
    LVar6 = LY_SUCCESS;
    sibling = root;
    do {
      if ((sibling->flags & 8) != 0) {
        in_EAX = lyd_validate_nested_ext(sibling,ext_val);
        iVar8 = 1;
        goto LAB_001ba862;
      }
      if (sibling->schema != (lysc_node *)0x0) {
        for (object = sibling->meta; object != (lyd_meta *)0x0; object = object->next) {
          lyplg_ext_get_storage(object->annotation,0x2e0000,8,&type);
          if ((type->plugin->validate != (lyplg_type_validate_clb)0x0) &&
             (in_EAX = ly_set_add(meta_types,object,'\x01',(uint32_t *)0x0), LVar2 = in_EAX,
             in_EAX != LY_SUCCESS)) goto LAB_001ba83c;
        }
        uVar1 = sibling->schema->nodetype;
        if (((uVar1 & 0xc) == 0) ||
           ((sibling->schema[1].parent)->parent->parent == (lysc_node *)0x0)) {
          if ((uVar1 & 0x711) == 0) goto LAB_001ba7a3;
          pplVar3 = lyd_node_child_p(sibling);
          in_EAX = lyd_validate_new(pplVar3,sibling->schema,(lys_module *)0x0,
                                    (lysc_ext_instance *)0x0,val_opts,int_opts,getnext_ht,diff);
          if ((in_EAX == LY_SUCCESS) ||
             ((LVar2 = in_EAX, in_EAX == LY_EVALID &&
              (LVar6 = LY_EVALID, in_EAX = val_opts, (val_opts & 4) != 0)))) {
            pplVar3 = lyd_node_child_p(sibling);
            in_EAX = lyd_new_implicit(sibling,pplVar3,(lysc_node *)0x0,(lys_module *)0x0,
                                      (ly_set *)0x0,(ly_set *)0x0,(ly_set *)0x0,
                                      val_opts >> 1 & 8 | val_opts & 1,getnext_ht,diff);
            LVar2 = in_EAX;
            if (in_EAX == LY_SUCCESS) goto LAB_001ba7a3;
          }
        }
        else {
          in_EAX = ly_set_add(node_types,sibling,'\x01',(uint32_t *)0x0);
          LVar2 = in_EAX;
          if (in_EAX != LY_SUCCESS) goto LAB_001ba83c;
LAB_001ba7a3:
          plVar4 = lysc_has_when(sibling->schema);
          if (((plVar4 == (lysc_when *)0x0) ||
              (in_EAX = ly_set_add(node_when,sibling,'\x01',(uint32_t *)0x0), LVar2 = in_EAX,
              in_EAX == LY_SUCCESS)) &&
             (in_EAX = lyd_validate_node_ext(sibling,ext_node), LVar2 = in_EAX, in_EAX == LY_SUCCESS
             )) goto LAB_001ba7da;
        }
LAB_001ba83c:
        LVar6 = LVar2;
        iVar8 = 9;
        goto LAB_001ba862;
      }
LAB_001ba7da:
      if ((sibling->schema == (lysc_node *)0x0) || ((sibling->schema->nodetype & 0x711) != 0)) {
        plVar5 = *(lyd_node **)(sibling + 1);
      }
      else {
        plVar5 = (lyd_node *)0x0;
      }
      if (plVar5 == (lyd_node *)0x0) {
        if (sibling == root) break;
        plVar5 = sibling->next;
      }
      if (plVar5 == (lyd_node *)0x0) {
        for (plVar7 = sibling->parent;
            ((plVar7->field_0).node.parent != root->parent &&
            (plVar5 = (plVar7->field_0).node.next, plVar5 == (lyd_node *)0x0));
            plVar7 = (plVar7->field_0).node.parent) {
        }
      }
      sibling = plVar5;
    } while (plVar5 != (lyd_node *)0x0);
    in_EAX = LY_SUCCESS;
    iVar8 = 0;
  }
LAB_001ba862:
  if ((iVar8 == 9) || (iVar8 == 0)) {
    in_EAX = LVar6;
  }
  return in_EAX;
}

Assistant:

static LY_ERR
lyd_validate_subtree(struct lyd_node *root, struct ly_set *node_when, struct ly_set *node_types,
        struct ly_set *meta_types, struct ly_set *ext_node, struct ly_set *ext_val, uint32_t val_opts,
        uint32_t int_opts, struct ly_ht *getnext_ht, struct lyd_node **diff)
{
    LY_ERR r, rc = LY_SUCCESS;
    const struct lyd_meta *meta;
    const struct lysc_type *type;
    struct lyd_node *node;
    uint32_t impl_opts;

    LYD_TREE_DFS_BEGIN(root, node) {
        if (node->flags & LYD_EXT) {
            /* validate using the extension instance callback */
            return lyd_validate_nested_ext(node, ext_val);
        }

        if (!node->schema) {
            /* do not validate opaque nodes */
            goto next_node;
        }

        LY_LIST_FOR(node->meta, meta) {
            lyplg_ext_get_storage(meta->annotation, LY_STMT_TYPE, sizeof type, (const void **)&type);
            if (type->plugin->validate) {
                /* metadata type resolution */
                r = ly_set_add(meta_types, (void *)meta, 1, NULL);
                LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
            }
        }

        if ((node->schema->nodetype & LYD_NODE_TERM) && ((struct lysc_node_leaf *)node->schema)->type->plugin->validate) {
            /* node type resolution */
            r = ly_set_add(node_types, (void *)node, 1, NULL);
            LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
        } else if (node->schema->nodetype & LYD_NODE_INNER) {
            /* new node validation, autodelete */
            r = lyd_validate_new(lyd_node_child_p(node), node->schema, NULL, NULL, val_opts, int_opts, getnext_ht, diff);
            LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

            /* add nested defaults */
            impl_opts = 0;
            if (val_opts & LYD_VALIDATE_NO_STATE) {
                impl_opts |= LYD_IMPLICIT_NO_STATE;
            }
            if (val_opts & LYD_VALIDATE_NO_DEFAULTS) {
                impl_opts |= LYD_IMPLICIT_NO_DEFAULTS;
            }
            r = lyd_new_implicit(node, lyd_node_child_p(node), NULL, NULL, NULL, NULL, NULL, impl_opts, getnext_ht, diff);
            LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
        }

        if (lysc_has_when(node->schema)) {
            /* when evaluation */
            r = ly_set_add(node_when, (void *)node, 1, NULL);
            LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
        }

        /* store for ext instance node validation, if needed */
        r = lyd_validate_node_ext(node, ext_node);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);

next_node:
        LYD_TREE_DFS_END(root, node);
    }

cleanup:
    return rc;
}